

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall wasm::String::Split::Split(Split *this,string *input,string *delim)

{
  long lVar1;
  size_type sVar2;
  ulong uVar3;
  long lVar4;
  value_type local_50;
  long local_30;
  size_type nextDelim;
  size_t lastEnd;
  string *delim_local;
  string *input_local;
  Split *this_local;
  
  lastEnd = (size_t)delim;
  delim_local = input;
  input_local = (string *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  nextDelim = 0;
  while( true ) {
    sVar2 = nextDelim;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= sVar2) break;
    local_30 = std::__cxx11::string::find((string *)delim_local,lastEnd);
    if (local_30 == -1) {
      local_30 = std::__cxx11::string::size();
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)delim_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = local_30;
    lVar4 = std::__cxx11::string::size();
    nextDelim = lVar1 + lVar4;
  }
  return;
}

Assistant:

Split(const std::string& input, const std::string& delim) {
    size_t lastEnd = 0;
    while (lastEnd < input.size()) {
      auto nextDelim = input.find(delim, lastEnd);
      if (nextDelim == std::string::npos) {
        nextDelim = input.size();
      }
      (*this).push_back(input.substr(lastEnd, nextDelim - lastEnd));
      lastEnd = nextDelim + delim.size();
    }
  }